

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::
unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxKind,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxKind>>>
::
unordered_flat_map<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxKind>const*>
          (unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxKind,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxKind>>>
           *this,pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::syntax::SyntaxKind>
                 *first,
          pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::syntax::SyntaxKind>
          *last,size_type n,hasher *h,key_equal *pred,allocator_type *a)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  uint64_t hash;
  long lVar11;
  ulong uVar12;
  ulong pos0;
  ulong uVar13;
  undefined1 auVar14 [16];
  locator local_48;
  
  detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::syntax::SyntaxKind>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::syntax::SyntaxKind>_>_>
  ::table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::syntax::SyntaxKind>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::syntax::SyntaxKind>_>_>
                *)this,n,h,pred,a);
  do {
    if (first == last) {
      return;
    }
    hash = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this,
                      &first->first);
    pos0 = hash >> ((byte)*this & 0x3f);
    lVar11 = (hash & 0xff) * 4;
    cVar4 = (&UNK_0043a38c)[lVar11];
    cVar5 = (&UNK_0043a38d)[lVar11];
    cVar6 = (&UNK_0043a38e)[lVar11];
    bVar7 = (&UNK_0043a38f)[lVar11];
    uVar13 = 0;
    uVar12 = pos0;
    do {
      lVar11 = *(long *)(this + 0x10);
      pcVar1 = (char *)(lVar11 + uVar12 * 0x10);
      bVar9 = pcVar1[0xf];
      auVar14[0] = -(*pcVar1 == cVar4);
      auVar14[1] = -(pcVar1[1] == cVar5);
      auVar14[2] = -(pcVar1[2] == cVar6);
      auVar14[3] = -(pcVar1[3] == bVar7);
      auVar14[4] = -(pcVar1[4] == cVar4);
      auVar14[5] = -(pcVar1[5] == cVar5);
      auVar14[6] = -(pcVar1[6] == cVar6);
      auVar14[7] = -(pcVar1[7] == bVar7);
      auVar14[8] = -(pcVar1[8] == cVar4);
      auVar14[9] = -(pcVar1[9] == cVar5);
      auVar14[10] = -(pcVar1[10] == cVar6);
      auVar14[0xb] = -(pcVar1[0xb] == bVar7);
      auVar14[0xc] = -(pcVar1[0xc] == cVar4);
      auVar14[0xd] = -(pcVar1[0xd] == cVar5);
      auVar14[0xe] = -(pcVar1[0xe] == cVar6);
      auVar14[0xf] = -(bVar9 == bVar7);
      uVar10 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
      if (uVar10 != 0) {
        lVar2 = *(long *)(this + 0x18);
        do {
          uVar3 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          bVar8 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             this,&first->first,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             ((ulong)uVar3 * 0x18 + lVar2 + uVar12 * 0x168));
          if (bVar8) goto LAB_001b494f;
          uVar10 = uVar10 - 1 & uVar10;
        } while (uVar10 != 0);
        bVar9 = *(byte *)(lVar11 + uVar12 * 0x10 + 0xf);
      }
      if (((&detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar9) == 0) break;
      lVar11 = uVar12 + uVar13;
      uVar13 = uVar13 + 1;
      uVar12 = lVar11 + 1U & *(ulong *)(this + 8);
    } while (uVar13 <= *(ulong *)(this + 8));
    if (*(ulong *)(this + 0x28) < *(ulong *)(this + 0x20)) {
      detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxKind>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxKind>>>
      ::
      unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxKind>const&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxKind>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxKind>>>
                  *)this,pos0,hash,first);
    }
    else {
      detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxKind>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxKind>>>
      ::
      unchecked_emplace_with_rehash<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxKind>const&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxKind>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxKind>>>
                  *)this,hash,first);
    }
LAB_001b494f:
    first = first + 1;
  } while( true );
}

Assistant:

unordered_flat_map(Iterator first, Iterator last, size_type n = 0, hasher const& h = hasher(),
                       key_equal const& pred = key_equal(),
                       allocator_type const& a = allocator_type()) :
        unordered_flat_map(n, h, pred, a) {
        this->insert(first, last);
    }